

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lysp_ext_dup(ly_ctx *ctx,lysp_module *pmod,void *parent,ly_stmt parent_stmt,
                   lysp_ext_instance *orig_ext,lysp_ext_instance *ext)

{
  LY_ERR LVar1;
  ly_set pmods;
  lysp_ctx pctx;
  ly_set local_88;
  lysp_ctx local_78;
  
  local_78.parsed_mods = &local_88;
  local_88.size = 0;
  local_88.count = 0;
  local_88.field_2.dnodes = (lyd_node **)0x0;
  local_78.ext_inst.field_2.dnodes = (lyd_node **)0x0;
  local_78.grps_nodes.field_2.dnodes = (lyd_node **)0x0;
  local_78.ext_inst.size = 0;
  local_78.ext_inst.count = 0;
  local_78.tpdfs_nodes.field_2.dnodes = (lyd_node **)0x0;
  local_78.grps_nodes.size = 0;
  local_78.grps_nodes.count = 0;
  local_78.format = LYS_IN_UNKNOWN;
  local_78._4_4_ = 0;
  local_78.tpdfs_nodes.size = 0;
  local_78.tpdfs_nodes.count = 0;
  local_78.main_ctx = (lysp_ctx *)0x0;
  LVar1 = lydict_dup(ctx,orig_ext->name,&ext->name);
  if ((LVar1 == LY_SUCCESS) &&
     (LVar1 = lydict_dup(ctx,orig_ext->argument,&ext->argument), LVar1 == LY_SUCCESS)) {
    ext->format = orig_ext->format;
    LVar1 = ly_dup_prefix_data(ctx,orig_ext->format,orig_ext->prefix_data,&ext->prefix_data);
    if (LVar1 == LY_SUCCESS) {
      ext->def = orig_ext->def;
      ext->parent = parent;
      ext->parent_stmt = parent_stmt;
      ext->parent_stmt_index = orig_ext->parent_stmt_index;
      ext->flags = orig_ext->flags;
      ext->record = orig_ext->record;
      LVar1 = lysp_ext_children_dup(ctx,orig_ext->child,&ext->child);
      if (LVar1 == LY_SUCCESS) {
        LVar1 = LY_SUCCESS;
        if (((ext->record != (lyplg_ext_record *)0x0) &&
            ((ext->record->plugin).parse != (lyplg_ext_parse_clb)0x0)) &&
           (LVar1 = ly_set_add(&local_88,pmod,'\x01',(uint32_t *)0x0), LVar1 == LY_SUCCESS)) {
          LVar1 = (*(ext->record->plugin).parse)(&local_78,ext);
        }
      }
    }
  }
  ly_set_erase(&local_88,(_func_void_void_ptr *)0x0);
  return LVar1;
}

Assistant:

static LY_ERR
lysp_ext_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, void *parent, enum ly_stmt parent_stmt,
        const struct lysp_ext_instance *orig_ext, struct lysp_ext_instance *ext)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_set pmods = {0};
    struct lysp_ctx pctx = {.parsed_mods = &pmods};

    DUP_STRING_GOTO(ctx, orig_ext->name, ext->name, ret, cleanup);
    DUP_STRING_GOTO(ctx, orig_ext->argument, ext->argument, ret, cleanup);
    ext->format = orig_ext->format;
    LY_CHECK_GOTO(ret = ly_dup_prefix_data(ctx, orig_ext->format, orig_ext->prefix_data, &ext->prefix_data), cleanup);
    ext->def = orig_ext->def;

    ext->parent = parent;
    ext->parent_stmt = parent_stmt;
    ext->parent_stmt_index = orig_ext->parent_stmt_index;
    ext->flags = orig_ext->flags;
    ext->record = orig_ext->record;

    LY_CHECK_GOTO(ret = lysp_ext_children_dup(ctx, orig_ext->child, &ext->child), cleanup);
    if (ext->record && ext->record->plugin.parse) {
        /* parse again */
        LY_CHECK_GOTO(ret = ly_set_add(&pmods, pmod, 1, NULL), cleanup);
        LY_CHECK_GOTO(ret = ext->record->plugin.parse(&pctx, ext), cleanup);
    }

cleanup:
    ly_set_erase(&pmods, NULL);
    return ret;
}